

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void add_pass_code(Grammar *g,Rule *r,char *pass_start,char *pass_end,char *code_start,
                  char *code_end,uint pass_line,uint code_line)

{
  anon_struct_40_4_d8687ec6_for_pass_code *v;
  Code **ppCVar1;
  Code **ppCVar2;
  uint uVar3;
  D_Pass *pDVar4;
  char *pcVar5;
  Code *pCVar6;
  uint uVar7;
  
  pDVar4 = find_pass(g,pass_start,pass_end);
  if (pDVar4 == (D_Pass *)0x0) {
    pcVar5 = dup_str(pass_start,pass_end);
    d_fail("unknown pass \'%s\' line %d",pcVar5,(ulong)pass_line);
  }
  uVar3 = (r->pass_code).n;
  uVar7 = pDVar4->index;
  if (uVar3 <= uVar7) {
    v = &r->pass_code;
    ppCVar2 = (r->pass_code).e;
    do {
      ppCVar1 = (r->pass_code).v;
      if (ppCVar1 == (Code **)0x0) {
        (r->pass_code).v = ppCVar2;
        (r->pass_code).n = uVar3 + 1;
        (r->pass_code).e[uVar3] = (Code *)0x0;
LAB_0013b618:
        uVar3 = uVar3 + 1;
      }
      else {
        if (ppCVar1 == ppCVar2) {
          if (2 < uVar3) goto LAB_0013b61f;
LAB_0013b5ef:
          v->n = uVar3 + 1;
          ppCVar1[uVar3] = (Code *)0x0;
          goto LAB_0013b618;
        }
        if ((uVar3 & 7) != 0) goto LAB_0013b5ef;
LAB_0013b61f:
        vec_add_internal(v,(void *)0x0);
        uVar3 = v->n;
        uVar7 = pDVar4->index;
      }
    } while (uVar3 <= uVar7);
  }
  pCVar6 = (Code *)malloc(0x10);
  (r->pass_code).v[uVar7] = pCVar6;
  pcVar5 = dup_str(code_start,code_end);
  ppCVar2 = (r->pass_code).v;
  uVar3 = pDVar4->index;
  ppCVar2[uVar3]->code = pcVar5;
  ppCVar2[uVar3]->line = code_line;
  return;
}

Assistant:

void add_pass_code(Grammar *g, Rule *r, char *pass_start, char *pass_end, char *code_start, char *code_end,
                   uint pass_line, uint code_line) {
  D_Pass *p = find_pass(g, pass_start, pass_end);
  if (!p) d_fail("unknown pass '%s' line %d", dup_str(pass_start, pass_end), pass_line);
  while (r->pass_code.n <= p->index) vec_add(&r->pass_code, NULL);
  r->pass_code.v[p->index] = MALLOC(sizeof(Code));
  r->pass_code.v[p->index]->code = dup_str(code_start, code_end);
  r->pass_code.v[p->index]->line = code_line;
}